

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangecontrols.cpp
# Opt level: O2

void __thiscall QAccessibleDial::QAccessibleDial(QAccessibleDial *this,QWidget *widget)

{
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QAccessibleAbstractSlider::QAccessibleAbstractSlider
            (&this->super_QAccessibleAbstractSlider,widget,Dial);
  *(undefined ***)&(this->super_QAccessibleAbstractSlider).super_QAccessibleWidget =
       &PTR__QAccessibleAbstractSlider_007e3080;
  *(undefined ***)
   &(this->super_QAccessibleAbstractSlider).super_QAccessibleWidget.super_QAccessibleActionInterface
       = &PTR__QAccessibleDial_007e3178;
  *(undefined ***)&(this->super_QAccessibleAbstractSlider).super_QAccessibleValueInterface =
       &PTR__QAccessibleDial_007e31c0;
  latin1.m_data = "valueChanged(int)";
  latin1.m_size = 0x11;
  QString::QString((QString *)&local_30,latin1);
  QAccessibleWidget::addControllingSignal((QAccessibleWidget *)this,(QString *)&local_30);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleDial::QAccessibleDial(QWidget *widget)
    : QAccessibleAbstractSlider(widget, QAccessible::Dial)
{
    Q_ASSERT(qobject_cast<QDial *>(widget));
    addControllingSignal("valueChanged(int)"_L1);
}